

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

Vector<long_double> * __thiscall
Vector<long_double>::operator=(Vector<long_double> *this,longdouble *val)

{
  uint uVar1;
  longdouble *plVar2;
  ulong uVar3;
  ulong uVar4;
  allocator<char> local_31;
  string local_30;
  
  uVar1 = this->num_elts;
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Vector< T >& Vector< T >::operator = (const T& val), unallocated vector",&local_31);
    ::error(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    plVar2 = this->ptr_to_data;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
      *(longdouble *)((long)plVar2 + uVar4) = *val;
    }
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const T& val)
{
  if (num_elts != 0)
    for (int i=0; i<num_elts; ++i)
      ptr_to_data[i] = val;
  else error("Vector< T >& Vector< T >::operator = (const T& val), unallocated vector");

  return *this;
}